

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListBuilder * __thiscall
capnp::_::OrphanBuilder::asStructList
          (ListBuilder *__return_storage_ptr__,OrphanBuilder *this,StructSize elementSize)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  SegmentId id;
  uint uVar3;
  CapTableBuilder *capTable;
  BuilderArena *pBVar4;
  ushort uVar5;
  SegmentBuilder *this_00;
  SegmentBuilder *pSVar6;
  SegmentBuilder *pSVar7;
  word *pwVar8;
  undefined8 *puVar9;
  OrphanBuilder *pOVar10;
  ushort uVar11;
  uint uVar12;
  ulong uVar13;
  WirePointer *pWVar14;
  WirePointer *__src;
  WirePointer *dst;
  int iVar15;
  SegmentBuilder **ppSVar16;
  ulong uVar17;
  ulong __n;
  ulong uVar18;
  StructSize SVar19;
  WirePointer *pWVar20;
  WirePointer *pWVar21;
  WirePointer *src;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  bool bVar25;
  AllocateResult AVar26;
  AllocateResult AVar27;
  ElementSize oldSize;
  WirePointer *local_110;
  SegmentBuilder *local_108;
  ulong local_100;
  WirePointer *local_f8;
  Iterator __end5;
  uint local_e8;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Fault f;
  
  uVar24 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  if (id.value != 0 || uVar24 != 0) {
    pSVar7 = this->segment;
    capTable = this->capTable;
    pBVar4 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
    if ((uVar24 & 3) == 2) {
      this_00 = BuilderArena::getSegment(pBVar4,id);
      uVar24 = (uint)(this->tag).content;
      pwVar8 = (this_00->super_SegmentReader).ptr.ptr;
      uVar18 = (ulong)(uVar24 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar8->content + uVar18);
      pOVar10 = (OrphanBuilder *)((long)&pwVar8[1].content + uVar18);
      if ((uVar24 & 4) == 0) {
        local_f8 = (WirePointer *)(&pOVar10->tag + ((int)(pOVar1->tag).content >> 2));
        pOVar10 = pOVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        local_f8 = (WirePointer *)
                   ((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                   (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      local_f8 = (WirePointer *)this->location;
      this_00 = pSVar7;
      pOVar10 = this;
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    local_110 = (WirePointer *)CONCAT44(local_110._4_4_,elementSize);
    _kjCondition.left = (Kind)(pOVar10->tag).content & OTHER;
    _kjCondition.right = LIST;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == LIST;
    local_108 = pSVar7;
    if (_kjCondition.left == LIST) {
      uVar12 = (uint)elementSize >> 0x10;
      uVar24 = *(uint *)((long)&(pOVar10->tag).content + 4);
      oldSize = (ElementSize)uVar24 & INLINE_COMPOSITE;
      uVar5 = elementSize.pointers;
      if (oldSize == INLINE_COMPOSITE) {
        _kjCondition.left = (local_f8->offsetAndKind).value & 3;
        _kjCondition.right = STRUCT;
        _kjCondition.op.content.ptr = " == ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = _kjCondition.left == 0;
        if (_kjCondition.left != 0) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[62]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x5c7,FAILED,"oldTag->kind() == WirePointer::STRUCT",
                     "_kjCondition,\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\""
                     ,&_kjCondition,
                     (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.")
          ;
          kj::_::Debug::Fault::~Fault(&f);
          iVar15 = 2;
          goto LAB_001880bd;
        }
        __src = local_f8 + 1;
        uVar2 = *(ushort *)&local_f8->field_1;
        uVar22 = (uint)uVar2;
        uVar11 = *(ushort *)((long)&local_f8->field_1 + 2);
        local_e8 = (uint)uVar11 + (uint)uVar2;
        local_100 = (ulong)local_e8;
        uVar18 = (ulong)((local_f8->offsetAndKind).value >> 2 & 0x1fffffff);
        if (uVar11 < uVar5 || uVar2 < elementSize.data) {
          SVar19.pointers = 0;
          SVar19.data = uVar2;
          if (uVar2 <= elementSize.data) {
            SVar19 = elementSize;
          }
          if (uVar5 < uVar11) {
            uVar12 = (uint)uVar11;
          }
          uVar22 = (uint)SVar19 & 0xffff;
          local_e8 = uVar12 + uVar22;
          uVar13 = uVar18 * local_e8;
          ___end5 = uVar18;
          if (0x1ffffffe < uVar13) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&_kjCondition);
          }
          pSVar7 = local_108;
          if ((((this->tag).content & 3) == 2) &&
             (pSVar6 = BuilderArena::getSegment
                                 ((BuilderArena *)(local_108->super_SegmentReader).arena,
                                  (SegmentId)*(uint *)((long)&(this->tag).content + 4)),
             pSVar6->readOnly == false)) {
            uVar24 = (uint)(this->tag).content;
            puVar9 = (undefined8 *)
                     ((long)&((pSVar6->super_SegmentReader).ptr.ptr)->content +
                     (ulong)(uVar24 & 0xfffffff8));
            if ((uVar24 & 4) == 0) {
              *puVar9 = 0;
            }
            else {
              *puVar9 = 0;
              puVar9[1] = 0;
            }
          }
          (this->tag).content = 0;
          iVar15 = (int)uVar13;
          uVar24 = iVar15 + 1;
          pOVar10 = this;
          if (pBVar4 == (BuilderArena *)0x0) {
            if (*(int *)((long)&(this->tag).content + 4) != 0 || (int)(this->tag).content != 0) {
              WireHelpers::zeroObject(pSVar7,capTable,(WirePointer *)this);
            }
            pwVar8 = pSVar7->pos;
            if ((long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                      ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)pwVar8)) >> 3 <
                (long)(ulong)uVar24) {
              pwVar8 = (word *)0x0;
            }
            else {
              pSVar7->pos = pwVar8 + uVar24;
            }
            AVar26.words = pwVar8;
            AVar26.segment = local_108;
            if (pwVar8 == (word *)0x0) {
              pBVar4 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
              if (0x1fffffff < iVar15 + 2U) {
                WireHelpers::allocate::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&_kjCondition);
              }
              AVar27 = BuilderArena::allocate(pBVar4,iVar15 + 2U);
              pOVar10 = (OrphanBuilder *)AVar27.words;
              pSVar7 = AVar27.segment;
              *(uint *)&(this->tag).content =
                   (int)AVar27.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U
                   | 2;
              *(uint *)((long)&(this->tag).content + 4) = (pSVar7->super_SegmentReader).id.value;
              *(undefined4 *)&(pOVar10->tag).content = 1;
              AVar26.words = (word *)&pOVar10->segment;
              AVar26.segment = pSVar7;
            }
            else {
              *(uint *)&(this->tag).content =
                   ((uint)((ulong)((long)pwVar8 - (long)this) >> 1) & 0xfffffffc) - 3;
            }
          }
          else {
            AVar26 = BuilderArena::allocate(pBVar4,uVar24);
            *(undefined4 *)&(this->tag).content = 0xfffffffd;
          }
          pwVar8 = AVar26.words;
          local_108 = AVar26.segment;
          *(int *)((long)&(pOVar10->tag).content + 4) = iVar15 * 8 + 7;
          *(int *)&pwVar8->content = (int)___end5 * 4;
          *(StructDataWordCount *)((long)&pwVar8->content + 4) = SVar19.data;
          uVar5 = (ushort)uVar12;
          *(ushort *)((long)&pwVar8->content + 6) = uVar5;
          pWVar20 = (WirePointer *)(pwVar8 + 1);
          uVar13 = local_100 & 0xffffffff;
          if ((int)___end5 != 0) {
            dst = (WirePointer *)(pwVar8 + (ulong)((uint)SVar19 & 0xffff) + 1);
            pWVar21 = local_f8 + (ulong)uVar2 + 1;
            local_100 = (ulong)(uint)((int)local_100 << 3);
            iVar15 = 0;
            pWVar14 = pWVar20;
            do {
              if (uVar2 != 0) {
                memcpy(pWVar14,__src,(ulong)uVar2 * 8);
              }
              pSVar7 = local_108;
              uVar18 = (ulong)uVar11;
              src = pWVar21;
              local_110 = dst;
              if (uVar11 != 0) {
                do {
                  WireHelpers::transferPointer(pSVar7,dst,this_00,src);
                  dst = dst + 1;
                  src = src + 1;
                  uVar18 = uVar18 - 1;
                } while (uVar18 != 0);
              }
              pWVar14 = pWVar14 + local_e8;
              __src = __src + uVar13;
              iVar15 = iVar15 + 1;
              dst = (WirePointer *)((long)&(local_110->offsetAndKind).value + (ulong)(local_e8 * 8))
              ;
              pWVar21 = (WirePointer *)((long)&(pWVar21->offsetAndKind).value + local_100);
            } while (iVar15 != (int)___end5);
          }
          uVar18 = ___end5;
          uVar13 = uVar13 * ___end5;
          if (0x1ffffffe < uVar13) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&_kjCondition);
          }
          this_00 = local_108;
          iVar15 = (int)uVar13 + 1;
          __src = pWVar20;
          uVar11 = uVar5;
          if (iVar15 != 0) {
            memset(local_f8,0,(ulong)(uint)(iVar15 * 8));
          }
        }
      }
      else {
        bVar25 = oldSize == POINTER;
        uVar18 = (ulong)(uVar24 >> 3);
        ___end5 = uVar18;
        if ((uVar24 & 7) == 0) {
          uVar22 = (uint)elementSize & 0xffff;
          local_e8 = uVar12 + ((uint)elementSize & 0xffff);
          uVar18 = local_e8 * uVar18;
          if (0x1ffffffe < uVar18) {
            WireHelpers::initStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&_kjCondition);
          }
          this_00 = local_108;
          if (*(int *)((long)&(this->tag).content + 4) != 0 || (int)(this->tag).content != 0) {
            WireHelpers::zeroObject(local_108,capTable,(WirePointer *)this);
          }
          ppSVar16 = (SegmentBuilder **)this_00->pos;
          uVar13 = uVar18 + 1 & 0xffffffff;
          if ((long)((long)(this_00->super_SegmentReader).ptr.ptr +
                    ((this_00->super_SegmentReader).ptr.size_ * 8 - (long)ppSVar16)) >> 3 <
              (long)uVar13) {
            ppSVar16 = (SegmentBuilder **)0x0;
          }
          else {
            this_00->pos = (word *)(ppSVar16 + uVar13);
          }
          if (ppSVar16 == (SegmentBuilder **)0x0) {
            uVar24 = (int)uVar18 + 2;
            pBVar4 = (BuilderArena *)(this_00->super_SegmentReader).arena;
            if (0x1fffffff < uVar24) {
              WireHelpers::allocate::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&_kjCondition);
            }
            AVar27 = BuilderArena::allocate(pBVar4,uVar24);
            pOVar10 = (OrphanBuilder *)AVar27.words;
            this_00 = AVar27.segment;
            *(uint *)&(this->tag).content =
                 (int)AVar27.words - *(int *)&(this_00->super_SegmentReader).ptr.ptr & 0xfffffff8U |
                 2;
            *(uint *)((long)&(this->tag).content + 4) = (this_00->super_SegmentReader).id.value;
            *(undefined4 *)&(pOVar10->tag).content = 1;
            ppSVar16 = &pOVar10->segment;
          }
          else {
            *(uint *)&(this->tag).content =
                 ((uint)((ulong)((long)ppSVar16 - (long)this) >> 1) & 0xfffffffc) - 3;
            pOVar10 = this;
          }
          *(int *)((long)&(pOVar10->tag).content + 4) = (int)uVar18 * 8 + 7;
          *(int *)ppSVar16 = (int)___end5 * 4;
          *(short *)((long)ppSVar16 + 4) = (short)local_110;
          *(ushort *)((long)ppSVar16 + 6) = uVar5;
          __src = (WirePointer *)(ppSVar16 + 1);
          uVar18 = ___end5;
        }
        else {
          uVar13 = (ulong)oldSize;
          uVar3 = (&BITS_PER_ELEMENT_TABLE)[uVar13];
          _kjCondition._0_8_ = &oldSize;
          _kjCondition.op.content.ptr = "which() == ";
          _kjCondition.op.content.size_ = (long)"  if (which() != " + 0xd;
          _kjCondition.result = true;
          _kjCondition._25_7_ = 0;
          if (oldSize == BIT) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize&,capnp::ElementSize>&,char_const(&)[123]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x61b,FAILED,"oldSize != ElementSize::BIT",
                       "_kjCondition,\"Schema mismatch: Found bit list where struct list was expected; upgrading boolean \" \"lists to structs is no longer supported.\""
                       ,(DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)&_kjCondition,
                       (char (*) [123])
                       "Schema mismatch: Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
                      );
            kj::_::Debug::Fault::~Fault(&f);
            iVar15 = 2;
            goto LAB_001880bd;
          }
          if (oldSize == POINTER) {
            uVar12 = uVar12 + (uVar12 == 0);
          }
          else {
            elementSize = (StructSize)
                          (((uint)elementSize & 0xffff) + (uint)(((uint)elementSize & 0xffff) == 0))
            ;
          }
          local_110 = (WirePointer *)CONCAT44(local_110._4_4_,elementSize);
          uVar22 = (uint)elementSize & 0xffff;
          local_e8 = (uVar12 & 0xffff) + uVar22;
          local_100 = local_e8 * uVar18;
          if (0x1ffffffe < local_100) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&_kjCondition);
          }
          iVar15 = (int)local_100;
          if (((this->tag).content & 3) == 2) {
            pSVar7 = BuilderArena::getSegment
                               ((BuilderArena *)(local_108->super_SegmentReader).arena,
                                (SegmentId)*(uint *)((long)&(this->tag).content + 4));
            iVar15 = (int)local_100;
            if (pSVar7->readOnly == false) {
              uVar23 = (uint)(this->tag).content;
              puVar9 = (undefined8 *)
                       ((long)&((pSVar7->super_SegmentReader).ptr.ptr)->content +
                       (ulong)(uVar23 & 0xfffffff8));
              if ((uVar23 & 4) == 0) {
                *puVar9 = 0;
              }
              else {
                *puVar9 = 0;
                puVar9[1] = 0;
              }
            }
          }
          pSVar7 = local_108;
          (this->tag).content = 0;
          uVar23 = iVar15 + 1;
          pOVar10 = this;
          if (pBVar4 == (BuilderArena *)0x0) {
            if (*(int *)((long)&(this->tag).content + 4) != 0 || (int)(this->tag).content != 0) {
              WireHelpers::zeroObject(local_108,capTable,(WirePointer *)this);
              iVar15 = (int)local_100;
            }
            pwVar8 = pSVar7->pos;
            if ((long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                      ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)pwVar8)) >> 3 <
                (long)(ulong)uVar23) {
              pwVar8 = (word *)0x0;
            }
            else {
              pSVar7->pos = pwVar8 + uVar23;
            }
            AVar27.words = pwVar8;
            AVar27.segment = local_108;
            if (pwVar8 == (word *)0x0) {
              pBVar4 = (BuilderArena *)(local_108->super_SegmentReader).arena;
              if (0x1fffffff < iVar15 + 2U) {
                WireHelpers::allocate::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&_kjCondition);
              }
              AVar27 = BuilderArena::allocate(pBVar4,iVar15 + 2U);
              pOVar10 = (OrphanBuilder *)AVar27.words;
              pSVar7 = AVar27.segment;
              *(uint *)&(this->tag).content =
                   (int)AVar27.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U
                   | 2;
              *(uint *)((long)&(this->tag).content + 4) = (pSVar7->super_SegmentReader).id.value;
              *(undefined4 *)&(pOVar10->tag).content = 1;
              AVar27.words = (word *)&pOVar10->segment;
              AVar27.segment = pSVar7;
              iVar15 = (int)local_100;
            }
            else {
              *(uint *)&(this->tag).content =
                   ((uint)((ulong)((long)pwVar8 - (long)this) >> 1) & 0xfffffffc) - 3;
            }
          }
          else {
            AVar27 = BuilderArena::allocate(pBVar4,uVar23);
            iVar15 = (int)local_100;
            *(undefined4 *)&(this->tag).content = 0xfffffffd;
          }
          pwVar8 = AVar27.words;
          local_108 = AVar27.segment;
          *(int *)((long)&(pOVar10->tag).content + 4) = iVar15 * 8 + 7;
          *(int *)&pwVar8->content = (int)___end5 * 4;
          *(short *)((long)&pwVar8->content + 4) = (short)(uint)local_110;
          *(short *)((long)&pwVar8->content + 6) = (short)uVar12;
          __src = (WirePointer *)(pwVar8 + 1);
          if (oldSize == POINTER) {
            if (7 < uVar24) {
              pWVar20 = __src + ((uint)local_110 & 0xffff);
              uVar13 = ___end5 & 0xffffffff;
              pWVar14 = local_f8;
              do {
                WireHelpers::transferPointer(local_108,pWVar20,this_00,pWVar14);
                pWVar14 = pWVar14 + 1;
                pWVar20 = (WirePointer *)
                          ((long)&(pWVar20->offsetAndKind).value + (ulong)(local_e8 * 8));
                uVar24 = (int)uVar13 - 1;
                uVar13 = (ulong)uVar24;
              } while (uVar24 != 0);
            }
          }
          else if (7 < uVar24) {
            __n = (ulong)(uVar3 >> 3);
            uVar17 = ___end5 & 0xffffffff;
            pWVar20 = __src;
            pWVar14 = local_f8;
            do {
              if (0xfffffffffffffffb < uVar13 - 6) {
                memcpy(pWVar20,pWVar14,__n);
              }
              pWVar14 = (WirePointer *)((long)&(pWVar14->offsetAndKind).value + __n);
              pWVar20 = (WirePointer *)
                        ((long)&(pWVar20->offsetAndKind).value + (ulong)(local_e8 * 8));
              uVar24 = (int)uVar17 - 1;
              uVar17 = (ulong)uVar24;
            } while (uVar24 != 0);
          }
          uVar18 = ((uint)bVar25 * 0x40 + uVar3) * uVar18;
          uVar13 = uVar18 + 0x3f;
          if (0x7ffffff80 < uVar18) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&_kjCondition);
          }
          uVar18 = ___end5;
          this_00 = local_108;
          if ((int)(uVar13 >> 6) != 0) {
            memset(local_f8,0,(ulong)((uint)(uVar13 >> 3) & 0xfffffff8));
          }
        }
        uVar11 = (ushort)uVar12;
      }
      __return_storage_ptr__->segment = this_00;
      __return_storage_ptr__->capTable = capTable;
      __return_storage_ptr__->ptr = (byte *)__src;
      __return_storage_ptr__->elementCount = (ListElementCount)uVar18;
      __return_storage_ptr__->step = local_e8 << 6;
      __return_storage_ptr__->structDataSize = uVar22 << 6;
      __return_storage_ptr__->structPointerCount = uVar11;
      __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
      iVar15 = 1;
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[85]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x5bb,FAILED,"oldRef->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Called getList{Field,Element}() but existing pointer is not a \" \"list.\""
                 ,&_kjCondition,
                 (char (*) [85])
                 "Schema mismatch: Called getList{Field,Element}() but existing pointer is not a list."
                );
      kj::_::Debug::Fault::~Fault(&f);
      iVar15 = 2;
    }
LAB_001880bd:
    if (iVar15 != 2) goto LAB_001880df;
  }
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
  __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
LAB_001880df:
  if ((__return_storage_ptr__->elementSize == INLINE_COMPOSITE) &&
     (__return_storage_ptr__->ptr != (byte *)0x0)) {
    pwVar8 = (word *)(__return_storage_ptr__->ptr + -8);
  }
  else {
    pwVar8 = (word *)__return_storage_ptr__->ptr;
  }
  this->location = pwVar8;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder OrphanBuilder::asStructList(StructSize elementSize) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  ListBuilder result = WireHelpers::getWritableStructListPointer(
      tagAsPtr(), location, segment, capTable, elementSize, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = result.getLocation();

  return result;
}